

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bz2_stream.cpp
# Opt level: O0

ssize_t __thiscall minibag::BZ2Stream::write(BZ2Stream *this,int __fd,void *__buf,size_t __n)

{
  undefined8 uVar1;
  BagException *this_00;
  uint64_t uVar2;
  ssize_t extraout_RAX;
  string *in_stack_ffffffffffffff58;
  BagException *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  void *in_stack_ffffffffffffff70;
  BZFILE *in_stack_ffffffffffffff78;
  allocator<char> *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  
  if (this->bzfile_ == (BZFILE *)0x0) {
    uVar1 = __cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    BagException::BagException(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    __cxa_throw(uVar1,&BagException::typeinfo,BagException::~BagException);
  }
  BZ2_bzWrite((int *)this,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
              (int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
  if (this->bzerror_ == -6) {
    this_00 = (BagException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    BagException::BagException(this_00,in_stack_ffffffffffffff58);
    __cxa_throw(this_00,&BagException::typeinfo,BagException::~BagException);
  }
  uVar2 = Stream::getCompressedIn(&this->super_Stream);
  Stream::setCompressedIn(&this->super_Stream,uVar2 + (long)__buf);
  return extraout_RAX;
}

Assistant:

void BZ2Stream::write(void* ptr, size_t size) {
    if (!bzfile_) {
        throw BagException("cannot write to unopened bzfile");
    }

    BZ2_bzWrite(&bzerror_, bzfile_, ptr, (int)size);

    switch (bzerror_) {
    case BZ_IO_ERROR: throw BagException("BZ_IO_ERROR: error writing the compressed file");
    }

    setCompressedIn(getCompressedIn() + size);
}